

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O0

void __thiscall
QMakeParser::enterScope(QMakeParser *this,ushort **tokPtr,bool special,ScopeState state)

{
  BlockScope *pBVar1;
  undefined4 in_ECX;
  byte in_DL;
  long *in_RSI;
  long in_RDI;
  uchar nest;
  qsizetype in_stack_ffffffffffffffc8;
  ushort *puVar2;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  uchar uVar3;
  
  pBVar1 = QStack<QMakeParser::BlockScope>::top((QStack<QMakeParser::BlockScope> *)0x315231);
  uVar3 = pBVar1->nest;
  QList<QMakeParser::BlockScope>::size((QList<QMakeParser::BlockScope> *)(in_RDI + 0x10));
  QList<QMakeParser::BlockScope>::resize
            ((QList<QMakeParser::BlockScope> *)
             CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8
            );
  pBVar1 = QStack<QMakeParser::BlockScope>::top((QStack<QMakeParser::BlockScope> *)0x315277);
  pBVar1->special = (bool)(in_DL & 1);
  puVar2 = (ushort *)*in_RSI;
  pBVar1 = QStack<QMakeParser::BlockScope>::top((QStack<QMakeParser::BlockScope> *)0x31529c);
  pBVar1->start = puVar2;
  pBVar1 = QStack<QMakeParser::BlockScope>::top((QStack<QMakeParser::BlockScope> *)0x3152ba);
  pBVar1->nest = uVar3;
  *in_RSI = *in_RSI + 4;
  *(undefined4 *)(in_RDI + 0x28) = in_ECX;
  *(undefined1 *)(in_RDI + 0x31) = 0;
  if ((bool)(in_DL & 1) != false) {
    *(undefined4 *)(in_RDI + 0x2c) = *(undefined4 *)(in_RDI + 8);
  }
  return;
}

Assistant:

void QMakeParser::enterScope(ushort *&tokPtr, bool special, ScopeState state)
{
    uchar nest = m_blockstack.top().nest;
    m_blockstack.resize(m_blockstack.size() + 1);
    m_blockstack.top().special = special;
    m_blockstack.top().start = tokPtr;
    m_blockstack.top().nest = nest;
    tokPtr += 2;
    m_state = state;
    m_canElse = false;
    if (special)
        m_markLine = m_lineNo;
}